

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkHandleFailure(ARKodeMem ark_mem,int flag)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  sunrealtype sVar4;
  sunrealtype sVar5;
  
  switch(flag) {
  case -0x37:
    pcVar3 = "A SUNAdjStepper operation failed unrecoverably";
    iVar2 = -0x37;
    iVar1 = 0xb4b;
    goto LAB_00166ad7;
  case -0x36:
    pcVar3 = "The forward recomputation of step failed unrecoverably";
    iVar2 = -0x36;
    iVar1 = 0xb43;
    goto LAB_00166ad7;
  case -0x35:
    pcVar3 = "A checkpoint operation failed unrecoverably";
    iVar2 = -0x35;
    iVar1 = 0xb47;
    goto LAB_00166ad7;
  default:
    pcVar3 = 
    "ARKODE encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
    ;
    flag = -99;
    iVar2 = -99;
    iVar1 = 0xb5c;
    goto LAB_00166ad7;
  case -0x33:
    pcVar3 = "An inner SUNStepper error occurred";
    iVar2 = -0x33;
    iVar1 = 0xb57;
    goto LAB_00166ad7;
  case -0x32:
    pcVar3 = "The max stage limit failed unrecoverably";
    iVar2 = -0x32;
    iVar1 = 0xb53;
    goto LAB_00166ad7;
  case -0x31:
    pcVar3 = "The dominant eigenvalue function failed unrecoverably";
    iVar2 = -0x31;
    iVar1 = 0xb4f;
    goto LAB_00166ad7;
  case -0x2e:
    pcVar3 = "The relaxation Jacobian failed unrecoverably";
    iVar2 = -0x2e;
    iVar1 = 0xb3f;
    goto LAB_00166ad7;
  case -0x2d:
    pcVar3 = "The relaxation function failed unrecoverably";
    iVar2 = -0x2d;
    iVar1 = 0xb3b;
    goto LAB_00166ad7;
  case -0x2c:
    pcVar3 = "The ARKODE relaxation module memory is NULL";
    iVar2 = -0x2c;
    iVar1 = 0xb37;
    goto LAB_00166ad7;
  case -0x2b:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g the relaxation module failed";
    iVar2 = -0x2b;
    iVar1 = 0xb32;
    break;
  case -0x29:
    pcVar3 = "ARKODE was provided an invalid method table";
    iVar2 = -0x29;
    iVar1 = 0xb2e;
    goto LAB_00166ad7;
  case -0x28:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g the interpolation module failed unrecoverably";
    iVar2 = -0x28;
    iVar1 = 0xb28;
    break;
  case -0x27:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g the user-supplied predictor failed in an unrecoverable manner.";
    iVar2 = -0x27;
    iVar1 = 0xb1c;
    break;
  case -0x26:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the stage postprocessing routine failed in an unrecoverable manner.";
    iVar2 = -0x26;
    iVar1 = 0xb24;
    break;
  case -0x25:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the step postprocessing routine failed in an unrecoverable manner.";
    iVar2 = -0x25;
    iVar1 = 0xb20;
    break;
  case -0x22:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the inner stepper failed in an unrecoverable manner.";
    iVar2 = -0x22;
    iVar1 = 0xb14;
    break;
  case -0x20:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g the nonlinear solver failed in an unrecoverable manner.";
    iVar2 = -0x20;
    iVar1 = 0xb18;
    break;
  case -0x1e:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g the nonlinear solver setup failed unrecoverably";
    iVar2 = -0x1e;
    iVar1 = 0xb0a;
    break;
  case -0x1c:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, a vector operation failed.";
    iVar2 = -0x1c;
    iVar1 = 0xb10;
    break;
  case -0x1b:
    pcVar3 = "tout too close to t0 to start integration.";
    iVar2 = -0x1b;
    iVar1 = 0xafe;
    goto LAB_00166ad7;
  case -0x13:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, unable to satisfy inequality constraints.";
    iVar2 = -0x13;
    iVar1 = 0xb02;
    break;
  case -0x10:
    pcVar3 = "The mass matrix solver failed.";
    iVar2 = -0x10;
    iVar1 = 0xb06;
LAB_00166ad7:
    arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,pcVar3);
    return flag;
  case -0xc:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the rootfinding routine failed in an unrecoverable manner.";
    iVar2 = -0xc;
    iVar1 = 0xafa;
    break;
  case -0xb:
    sVar5 = ark_mem->tcur;
    pcVar3 = 
    "At t = %.15g, the right-hand side failed in a recoverable manner, but no recovery is possible."
    ;
    iVar2 = -0xb;
    iVar1 = 0xaf2;
    break;
  case -10:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g repeated recoverable right-hand side function errors.";
    iVar2 = -10;
    iVar1 = 0xaf6;
    break;
  case -8:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the right-hand side routine failed in an unrecoverable manner.";
    iVar2 = -8;
    iVar1 = 0xaee;
    break;
  case -7:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the solve routine failed in an unrecoverable manner.";
    iVar2 = -7;
    iVar1 = 0xaea;
    break;
  case -6:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %.15g, the setup routine failed in an unrecoverable manner.";
    iVar2 = -6;
    iVar1 = 0xae6;
    break;
  case -4:
    sVar5 = ark_mem->h;
    sVar4 = ark_mem->tcur;
    pcVar3 = 
    "At t = %.15g and h = %.15g, the solver convergence test failed repeatedly or with |h| = hmin.";
    iVar2 = -4;
    iVar1 = 0xae2;
    goto LAB_001668d5;
  case -3:
    sVar5 = ark_mem->h;
    sVar4 = ark_mem->tcur;
    pcVar3 = "At t = %.15g and h = %.15g, the error test failed repeatedly or with |h| = hmin.";
    iVar2 = -3;
    iVar1 = 0xade;
LAB_001668d5:
    arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,pcVar3,sVar4,sVar5);
    return flag;
  }
  arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,pcVar3,sVar5);
  return flag;
}

Assistant:

int arkHandleFailure(ARKodeMem ark_mem, int flag)
{
  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case ARK_ERR_FAILURE:
    arkProcessError(ark_mem, ARK_ERR_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_ERR_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_CONV_FAILURE:
    arkProcessError(ark_mem, ARK_CONV_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_CONV_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_LSETUP_FAIL:
    arkProcessError(ark_mem, ARK_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SETUP_FAILED, ark_mem->tcur);
    break;
  case ARK_LSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SOLVE_FAILED, ark_mem->tcur);
    break;
  case ARK_RHSFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RHSFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_UNREC_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_UNREC_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_UNREC, ark_mem->tcur);
    break;
  case ARK_REPTD_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_REPTD_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_REPTD, ark_mem->tcur);
    break;
  case ARK_RTFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_TOO_CLOSE:
    arkProcessError(ark_mem, ARK_TOO_CLOSE, __LINE__, __func__, __FILE__,
                    MSG_ARK_TOO_CLOSE);
    break;
  case ARK_CONSTR_FAIL:
    arkProcessError(ark_mem, ARK_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_FAILED_CONSTR, ark_mem->tcur);
    break;
  case ARK_MASSSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MASSSOLVE_FAIL);
    break;
  case ARK_NLS_SETUP_FAIL:
    arkProcessError(ark_mem, ARK_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G
                    " the nonlinear solver setup failed unrecoverably",
                    ark_mem->tcur);
    break;
  case ARK_VECTOROP_ERR:
    arkProcessError(ark_mem, ARK_VECTOROP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_VECTOROP_ERR, ark_mem->tcur);
    break;
  case ARK_INNERSTEP_FAIL:
    arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_INNERSTEP_FAILED, ark_mem->tcur);
    break;
  case ARK_NLS_OP_ERR:
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_NLS_FAIL, ark_mem->tcur);
    break;
  case ARK_USER_PREDICT_FAIL:
    arkProcessError(ark_mem, ARK_USER_PREDICT_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_USER_PREDICT_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STEP_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STEP_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STEP_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STAGE_FAIL, ark_mem->tcur);
    break;
  case ARK_INTERP_FAIL:
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G
                    " the interpolation module failed unrecoverably",
                    ark_mem->tcur);
    break;
  case ARK_INVALID_TABLE:
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "ARKODE was provided an invalid method table");
    break;
  case ARK_RELAX_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G " the relaxation module failed",
                    ark_mem->tcur);
    break;
  case ARK_RELAX_MEM_NULL:
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    "The ARKODE relaxation module memory is NULL");
    break;
  case ARK_RELAX_FUNC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FUNC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation function failed unrecoverably");
    break;
  case ARK_RELAX_JAC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_JAC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian failed unrecoverably");
    break;
  case ARK_ADJ_RECOMPUTE_FAIL:
    arkProcessError(ark_mem, ARK_ADJ_RECOMPUTE_FAIL, __LINE__, __func__, __FILE__,
                    "The forward recomputation of step failed unrecoverably");
    break;
  case ARK_ADJ_CHECKPOINT_FAIL:
    arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                    __FILE__, "A checkpoint operation failed unrecoverably");
    break;
  case ARK_SUNADJSTEPPER_ERR:
    arkProcessError(ark_mem, ARK_SUNADJSTEPPER_ERR, __LINE__, __func__,
                    __FILE__, "A SUNAdjStepper operation failed unrecoverably");
    break;
  case ARK_DOMEIG_FAIL:
    arkProcessError(ark_mem, ARK_DOMEIG_FAIL, __LINE__, __func__, __FILE__,
                    "The dominant eigenvalue function failed unrecoverably");
    break;
  case ARK_MAX_STAGE_LIMIT_FAIL:
    arkProcessError(ark_mem, ARK_MAX_STAGE_LIMIT_FAIL, __LINE__, __func__,
                    __FILE__, "The max stage limit failed unrecoverably");
    break;
  case ARK_SUNSTEPPER_ERR:
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "An inner SUNStepper error occurred");
    break;
  default:
    /* This return should never happen */
    arkProcessError(ark_mem, ARK_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                    "ARKODE encountered an unrecognized error. Please report "
                    "this to the Sundials developers at "
                    "sundials-users@llnl.gov");
    return (ARK_UNRECOGNIZED_ERROR);
  }

  return (flag);
}